

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::declare_temporary_abi_cxx11_
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id)

{
  anon_class_8_2_3ce7c506_for__M_pred __pred;
  Bitset *pBVar1;
  uint32_t id;
  mapped_type *pmVar2;
  size_type sVar3;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar4;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar5;
  uint32_t in_ECX;
  undefined4 in_register_00000034;
  CompilerGLSL *this_00;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar6;
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  char *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  _Node_iterator_base<unsigned_int,_false> local_58;
  undefined1 local_50;
  uint32_t local_48;
  uint32_t uStack_44;
  SPIRBlock *local_40;
  SPIRBlock *header;
  Bitset *local_30;
  Bitset *flags;
  SPIRType *type;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  this_00 = (CompilerGLSL *)CONCAT44(in_register_00000034,result_type);
  type._0_4_ = in_ECX;
  type._4_4_ = result_id;
  _result_id_local = this_00;
  this_local = this;
  flags = (Bitset *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this_00,result_id);
  TypedID<(spirv_cross::Types)0>::TypedID
            ((TypedID<(spirv_cross::Types)0> *)((long)&header + 4),(uint32_t)type);
  pmVar2 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this_00->super_Compiler).ir.meta,(key_type *)((long)&header + 4));
  local_30 = &(pmVar2->decoration).decoration_flags;
  if ((this_00->current_continue_block != (SPIRBlock *)0x0) &&
     (sVar3 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(&(this_00->super_Compiler).hoisted_temporaries,(key_type *)&type), sVar3 == 0)
     ) {
    id = TypedID::operator_cast_to_unsigned_int
                   ((TypedID *)&this_00->current_continue_block->loop_dominator);
    local_40 = Compiler::get<spirv_cross::SPIRBlock>((Compiler *)this_00,id);
    ppVar4 = ::std::
             begin<spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>>
                       (&local_40->declare_temporary);
    ppVar5 = ::std::
             end<spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>>
                       (&local_40->declare_temporary);
    local_48 = type._4_4_;
    uStack_44 = (uint32_t)type;
    __pred.result_id = (uint32_t)type;
    __pred.result_type = type._4_4_;
    ppVar4 = ::std::
             find_if<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,spirv_cross::CompilerGLSL::declare_temporary[abi:cxx11](unsigned_int,unsigned_int)::__0>
                       (ppVar4,ppVar5,__pred);
    ppVar5 = ::std::
             end<spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>>
                       (&local_40->declare_temporary);
    if (ppVar4 == ppVar5) {
      SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>
      ::emplace_back<unsigned_int&,unsigned_int&>
                ((SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>
                  *)&local_40->declare_temporary,(uint *)((long)&type + 4),(uint *)&type);
      pVar6 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(&(this_00->super_Compiler).hoisted_temporaries,(value_type *)&type);
      local_58._M_cur =
           (__node_type *)pVar6.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_50 = pVar6.second;
      Compiler::force_recompile((Compiler *)this_00);
    }
    (*(this_00->super_Compiler)._vptr_Compiler[6])(local_78,this_00,(ulong)(uint32_t)type,1);
    join<std::__cxx11::string,char_const(&)[4]>((spirv_cross *)this,local_78,(char (*) [4])0x4f38c2)
    ;
    ::std::__cxx11::string::~string((string *)local_78);
    return this;
  }
  sVar3 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(&(this_00->super_Compiler).hoisted_temporaries,(key_type *)&type);
  if (sVar3 == 0) {
    add_local_variable_name(this_00,(uint32_t)type);
    local_b0 = flags_to_qualifiers_glsl(this_00,(SPIRType *)flags,local_30);
    pBVar1 = flags;
    (*(this_00->super_Compiler)._vptr_Compiler[6])(local_f0,this_00,(ulong)(uint32_t)type,1);
    (*(this_00->super_Compiler)._vptr_Compiler[0x1a])(local_d0,this_00,pBVar1,local_f0,0);
    join<char_const*,std::__cxx11::string,char_const(&)[4]>
              ((spirv_cross *)this,&local_b0,local_d0,(char (*) [4])0x4f38c2);
    ::std::__cxx11::string::~string((string *)local_d0);
    ::std::__cxx11::string::~string(local_f0);
  }
  else {
    (*(this_00->super_Compiler)._vptr_Compiler[6])(local_a8,this_00,(ulong)(uint32_t)type,1);
    join<std::__cxx11::string,char_const(&)[4]>((spirv_cross *)this,local_a8,(char (*) [4])0x4f38c2)
    ;
    ::std::__cxx11::string::~string((string *)local_a8);
  }
  return this;
}

Assistant:

string CompilerGLSL::declare_temporary(uint32_t result_type, uint32_t result_id)
{
	auto &type = get<SPIRType>(result_type);
	auto &flags = ir.meta[result_id].decoration.decoration_flags;

	// If we're declaring temporaries inside continue blocks,
	// we must declare the temporary in the loop header so that the continue block can avoid declaring new variables.
	if (current_continue_block && !hoisted_temporaries.count(result_id))
	{
		auto &header = get<SPIRBlock>(current_continue_block->loop_dominator);
		if (find_if(begin(header.declare_temporary), end(header.declare_temporary),
		            [result_type, result_id](const pair<uint32_t, uint32_t> &tmp) {
			            return tmp.first == result_type && tmp.second == result_id;
		            }) == end(header.declare_temporary))
		{
			header.declare_temporary.emplace_back(result_type, result_id);
			hoisted_temporaries.insert(result_id);
			force_recompile();
		}

		return join(to_name(result_id), " = ");
	}
	else if (hoisted_temporaries.count(result_id))
	{
		// The temporary has already been declared earlier, so just "declare" the temporary by writing to it.
		return join(to_name(result_id), " = ");
	}
	else
	{
		// The result_id has not been made into an expression yet, so use flags interface.
		add_local_variable_name(result_id);
		return join(flags_to_qualifiers_glsl(type, flags), variable_decl(type, to_name(result_id)), " = ");
	}
}